

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleRemove
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool recurse)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string fileName;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  cmFileCommand *local_38;
  
  local_58 = &local_48;
  local_50 = 0;
  local_48 = 0;
  __rhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start + 1;
  local_38 = this;
  if (__rhs != (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pcVar1 = (__rhs->_M_dataplus)._M_p;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar1,pcVar1 + __rhs->_M_string_length);
      bVar3 = cmsys::SystemTools::FileIsFullPath(local_78._M_dataplus._M_p);
      if (!bVar3) {
        __s = cmMakefile::GetCurrentSourceDirectory((local_38->super_cmCommand).Makefile);
        sVar2 = local_78._M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)&local_78,0,(char *)sVar2,(ulong)__s);
        std::operator+(&local_98,"/",__rhs);
        std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      bVar3 = cmsys::SystemTools::FileIsDirectory(&local_78);
      if (bVar3) {
        bVar3 = cmsys::SystemTools::FileIsSymlink(&local_78);
        if (bVar3 || !recurse) goto LAB_0035e637;
        cmsys::SystemTools::RemoveADirectory(&local_78);
      }
      else {
LAB_0035e637:
        cmsys::SystemTools::RemoveFile(&local_78);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      __rhs = __rhs + 1;
    } while (__rhs != (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return true;
}

Assistant:

bool cmFileCommand::HandleRemove(std::vector<std::string> const& args,
                                 bool recurse)
{

  std::string message;
  std::vector<std::string>::const_iterator i = args.begin();

  i++; // Get rid of subcommand
  for(;i != args.end(); ++i)
    {
    std::string fileName = *i;
    if(!cmsys::SystemTools::FileIsFullPath(fileName.c_str()))
      {
      fileName = this->Makefile->GetCurrentSourceDirectory();
      fileName += "/" + *i;
      }

    if(cmSystemTools::FileIsDirectory(fileName) &&
       !cmSystemTools::FileIsSymlink(fileName) && recurse)
      {
      cmSystemTools::RemoveADirectory(fileName);
      }
    else
      {
      cmSystemTools::RemoveFile(fileName);
      }
    }
  return true;
}